

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.h
# Opt level: O0

void __thiscall Jupiter::IRC::Client::User::User(User *this)

{
  User *this_local;
  
  this->m_channel_count = 0;
  std::__cxx11::string::string((string *)&this->m_nickname);
  std::__cxx11::string::string((string *)&this->m_username);
  std::__cxx11::string::string((string *)&this->m_hostname);
  return;
}

Assistant:

class JUPITER_API User
			{
				friend class Jupiter::IRC::Client;
				friend class Jupiter::IRC::Client::Channel;
			public:

				/**
				* @brief Fetches the user's nickname.
				*
				* @return String containing the user's nickname.
				*/
				const std::string& getNickname() const;

				/**
				* @brief Fetches the user's username.
				*
				* @return String containing the user's username.
				*/
				const std::string& getUsername() const;

				/**
				* @brief Fetches the user's hostname.
				*
				* @return String containing the user's hostname.
				*/
				const std::string& getHostname() const;

				/**
				* @brief Returns the number of channels the user shares with the local client.
				*
				* @return Number of channels.
				*/
				size_t getChannelCount() const;

				/** Private members */
			private:
				unsigned int m_channel_count = 0;
				std::string m_nickname;
				std::string m_username;
				std::string m_hostname;
			}